

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O1

bool google::protobuf::compiler::js::anon_unknown_0::HasExtensions(Descriptor *desc)

{
  bool bVar1;
  bool bVar2;
  long lVar3;
  long lVar4;
  
  bVar2 = 0 < *(int *)(desc + 0x7c);
  if (0 < *(int *)(desc + 0x7c)) {
    lVar4 = 0;
    lVar3 = 0;
    do {
      if (((*(byte *)(*(long *)(desc + 0x50) + 1 + lVar4) & 8) != 0) &&
         (bVar1 = IgnoreField((FieldDescriptor *)(*(long *)(desc + 0x50) + lVar4)), !bVar1)) {
        if (bVar2) {
          return true;
        }
        break;
      }
      lVar3 = lVar3 + 1;
      lVar4 = lVar4 + 0x48;
      bVar2 = lVar3 < *(int *)(desc + 0x7c);
    } while (lVar3 < *(int *)(desc + 0x7c));
  }
  bVar2 = 0 < *(int *)(desc + 0x70);
  if ((0 < *(int *)(desc + 0x70)) && (bVar1 = HasExtensions(*(Descriptor **)(desc + 0x38)), !bVar1))
  {
    lVar4 = 0;
    lVar3 = 0x88;
    do {
      lVar4 = lVar4 + 1;
      bVar2 = lVar4 < *(int *)(desc + 0x70);
      if (*(int *)(desc + 0x70) <= lVar4) {
        return bVar2;
      }
      bVar1 = HasExtensions((Descriptor *)(lVar3 + *(long *)(desc + 0x38)));
      lVar3 = lVar3 + 0x88;
    } while (!bVar1);
  }
  return bVar2;
}

Assistant:

bool HasExtensions(const Descriptor* desc) {
  for (int i = 0; i < desc->extension_count(); i++) {
    if (ShouldGenerateExtension(desc->extension(i))) {
      return true;
    }
  }
  for (int i = 0; i < desc->nested_type_count(); i++) {
    if (HasExtensions(desc->nested_type(i))) {
      return true;
    }
  }
  return false;
}